

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

uint __thiscall trompeloeil::sequence_type::cost(sequence_type *this,sequence_matcher *m)

{
  uint uVar1;
  uint uVar2;
  sequence_matcher *e;
  sequence_matcher *psVar3;
  
  uVar2 = 0;
  psVar3 = (sequence_matcher *)this;
  while (((psVar3 = *(sequence_matcher **)(psVar3 + 8), uVar1 = 0xffffffff,
          psVar3 != (sequence_matcher *)this && (uVar1 = uVar2, psVar3 != m)) &&
         (uVar1 = 0xffffffff,
         *(ulong *)(*(long *)(psVar3 + 0x38) + 8) <= *(ulong *)(*(long *)(psVar3 + 0x38) + 0x18))))
  {
    uVar2 = uVar2 + 1;
  }
  return uVar1;
}

Assistant:

const
  noexcept
  {
    unsigned sequence_cost = 0U;
    for (auto& e : matchers)
    {
      if (&e == m) return sequence_cost;
      if (!e.is_satisfied())
      {
        return ~0U;
      }
      ++sequence_cost;
    }
    return ~0U;
  }